

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

bool __thiscall absl::Mutex::TryLock(Mutex *this)

{
  __atomic_base<long> _Var1;
  __atomic_base<long> local_98;
  intptr_t v;
  Mutex *this_local;
  ulong local_80;
  memory_order local_78;
  int local_74;
  memory_order __b;
  undefined1 local_61;
  ulong local_60;
  undefined4 local_58;
  undefined4 local_54;
  ulong local_50;
  __atomic_base<long> *local_48;
  Mutex *local_40;
  undefined1 local_31;
  ulong local_30;
  undefined4 local_28;
  undefined4 local_24;
  ulong local_20;
  __atomic_base<long> *local_18;
  Mutex *local_10;
  
  local_74 = 0;
  v = (intptr_t)this;
  ___b = this;
  local_78 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_74 - 1U < 2) {
    local_80 = (this->mu_).super___atomic_base<long>._M_i;
  }
  else if (local_74 == 5) {
    local_80 = (this->mu_).super___atomic_base<long>._M_i;
  }
  else {
    local_80 = (this->mu_).super___atomic_base<long>._M_i;
  }
  local_98._M_i = local_80;
  _Var1._M_i = local_98._M_i;
  if ((local_80 & 0x19) == 0) {
    local_30 = local_80 | 8;
    local_18 = &local_98;
    local_24 = 2;
    local_28 = 0;
    LOCK();
    _Var1._M_i = (this->mu_).super___atomic_base<long>._M_i;
    local_31 = local_80 == _Var1._M_i;
    if ((bool)local_31) {
      (this->mu_).super___atomic_base<long>._M_i = local_30;
      _Var1._M_i = local_80;
    }
    UNLOCK();
    local_20 = local_30;
    local_10 = this;
    if ((bool)local_31) {
      DebugOnlyLockEnter(this);
      return true;
    }
  }
  local_98._M_i = _Var1._M_i;
  if ((local_98._M_i & 0x10U) != 0) {
    _Var1._M_i = local_98._M_i;
    if ((local_98._M_i & 9U) == 0) {
      local_60 = local_98._M_i | 8;
      local_48 = &local_98;
      local_54 = 2;
      local_58 = 0;
      LOCK();
      _Var1._M_i = (this->mu_).super___atomic_base<long>._M_i;
      local_61 = local_98._M_i == _Var1._M_i;
      if ((bool)local_61) {
        (this->mu_).super___atomic_base<long>._M_i = local_60;
        _Var1._M_i = local_98._M_i;
      }
      UNLOCK();
      local_50 = local_60;
      local_40 = this;
      if ((bool)local_61) {
        DebugOnlyLockEnter(this);
        PostSynchEvent(this,0);
        return true;
      }
    }
    local_98._M_i = _Var1._M_i;
    PostSynchEvent(this,1);
  }
  return false;
}

Assistant:

bool Mutex::TryLock() {
  ABSL_TSAN_MUTEX_PRE_LOCK(this, __tsan_mutex_try_lock);
  intptr_t v = mu_.load(std::memory_order_relaxed);
  if ((v & (kMuWriter | kMuReader | kMuEvent)) == 0 &&  // try fast acquire
      mu_.compare_exchange_strong(v, kMuWriter | v,
                                  std::memory_order_acquire,
                                  std::memory_order_relaxed)) {
    DebugOnlyLockEnter(this);
    ABSL_TSAN_MUTEX_POST_LOCK(this, __tsan_mutex_try_lock, 0);
    return true;
  }
  if ((v & kMuEvent) != 0) {              // we're recording events
    if ((v & kExclusive->slow_need_zero) == 0 &&  // try fast acquire
        mu_.compare_exchange_strong(
            v, (kExclusive->fast_or | v) + kExclusive->fast_add,
            std::memory_order_acquire, std::memory_order_relaxed)) {
      DebugOnlyLockEnter(this);
      PostSynchEvent(this, SYNCH_EV_TRYLOCK_SUCCESS);
      ABSL_TSAN_MUTEX_POST_LOCK(this, __tsan_mutex_try_lock, 0);
      return true;
    } else {
      PostSynchEvent(this, SYNCH_EV_TRYLOCK_FAILED);
    }
  }
  ABSL_TSAN_MUTEX_POST_LOCK(
      this, __tsan_mutex_try_lock | __tsan_mutex_try_lock_failed, 0);
  return false;
}